

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_render.cpp
# Opt level: O1

void __thiscall TexturesOnViewportEdge::check(TexturesOnViewportEdge *this)

{
  ostream *poVar1;
  ostream *poVar2;
  char *pcVar3;
  int y;
  int y_00;
  uint x;
  uint x_00;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  vec4 vVar4;
  vec4 v;
  vec4 v_00;
  
  (*((this->super_StaticRenderTest).m_surface)->m_impl->_vptr_SurfaceBackendImpl[6])();
  if ((this->super_StaticRenderTest).m_w < 1) {
    pcVar3 = "0 < m_w";
  }
  else if ((this->super_StaticRenderTest).m_h < 1) {
    pcVar3 = "0 < m_h";
  }
  else {
    vVar4 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0,0);
    if ((((ABS(vVar4.x + -0.5) < 0.01) && (ABS(vVar4.y) < 0.01)) && (ABS(vVar4.z) < 0.01)) &&
       (ABS(vVar4.w + -1.0) < 0.01)) {
      if ((this->super_StaticRenderTest).m_w < 2) {
        pcVar3 = "1 < m_w";
      }
      else if ((this->super_StaticRenderTest).m_h < 1) {
        pcVar3 = "0 < m_h";
      }
      else {
        vVar4 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,1,0);
        if (((ABS(vVar4.x) < 0.01) && (ABS(vVar4.y) < 0.01)) &&
           ((ABS(vVar4.z) < 0.01 && (ABS(vVar4.w + -1.0) < 0.01)))) {
          if ((this->super_StaticRenderTest).m_w < 2) {
            pcVar3 = "1 < m_w";
          }
          else if ((this->super_StaticRenderTest).m_h < 2) {
            pcVar3 = "1 < m_h";
          }
          else {
            vVar4 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,1,1);
            if (((ABS(vVar4.x) < 0.01) && (ABS(vVar4.y) < 0.01)) &&
               ((ABS(vVar4.z) < 0.01 && (ABS(vVar4.w + -1.0) < 0.01)))) {
              if ((this->super_StaticRenderTest).m_w < 1) {
                pcVar3 = "0 < m_w";
              }
              else if ((this->super_StaticRenderTest).m_h < 2) {
                pcVar3 = "1 < m_h";
              }
              else {
                vVar4 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0,1);
                if ((((ABS(vVar4.x) < 0.01) && (ABS(vVar4.y) < 0.01)) && (ABS(vVar4.z) < 0.01)) &&
                   (ABS(vVar4.w + -1.0) < 0.01)) {
                  x = (uint)(extraout_XMM0_Da + -1.0);
                  if ((int)x < 0) {
                    pcVar3 = "r >= 0";
                  }
                  else if ((int)x < (this->super_StaticRenderTest).m_w) {
                    if ((this->super_StaticRenderTest).m_h < 1) {
                      pcVar3 = "0 < m_h";
                    }
                    else {
                      vVar4 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,x,0);
                      if (((ABS(vVar4.x) < 0.01) && (ABS(vVar4.y + -0.25) < 0.01)) &&
                         ((ABS(vVar4.z) < 0.01 && (ABS(vVar4.w + -1.0) < 0.01)))) {
                        x_00 = x - 1;
                        if (x == 0) {
                          pcVar3 = "r-1 >= 0";
                        }
                        else if ((this->super_StaticRenderTest).m_w < (int)x) {
                          pcVar3 = "r-1 < m_w";
                        }
                        else if ((this->super_StaticRenderTest).m_h < 1) {
                          pcVar3 = "0 < m_h";
                        }
                        else {
                          vVar4 = rengine::StaticRenderTest::pixel
                                            (&this->super_StaticRenderTest,x_00,0);
                          if (((ABS(vVar4.x) < 0.01) && (ABS(vVar4.y) < 0.01)) &&
                             ((ABS(vVar4.z) < 0.01 && (ABS(vVar4.w + -1.0) < 0.01)))) {
                            if ((int)x < (this->super_StaticRenderTest).m_w) {
                              if ((this->super_StaticRenderTest).m_h < 2) {
                                pcVar3 = "1 < m_h";
                              }
                              else {
                                vVar4 = rengine::StaticRenderTest::pixel
                                                  (&this->super_StaticRenderTest,x,1);
                                if ((((ABS(vVar4.x) < 0.01) && (ABS(vVar4.y) < 0.01)) &&
                                    (ABS(vVar4.z) < 0.01)) && (ABS(vVar4.w + -1.0) < 0.01)) {
                                  if ((this->super_StaticRenderTest).m_w < (int)x) {
                                    pcVar3 = "r-1 < m_w";
                                  }
                                  else if ((this->super_StaticRenderTest).m_h < 2) {
                                    pcVar3 = "1 < m_h";
                                  }
                                  else {
                                    vVar4 = rengine::StaticRenderTest::pixel
                                                      (&this->super_StaticRenderTest,x_00,1);
                                    if (((ABS(vVar4.x) < 0.01) && (ABS(vVar4.y) < 0.01)) &&
                                       ((ABS(vVar4.z) < 0.01 && (ABS(vVar4.w + -1.0) < 0.01)))) {
                                      if ((this->super_StaticRenderTest).m_w < 1) {
                                        pcVar3 = "0 < m_w";
                                      }
                                      else {
                                        y = (int)(extraout_XMM0_Db + -1.0);
                                        if (y < 0) {
                                          pcVar3 = "b >= 0";
                                        }
                                        else if (y < (this->super_StaticRenderTest).m_h) {
                                          vVar4 = rengine::StaticRenderTest::pixel
                                                            (&this->super_StaticRenderTest,0,y);
                                          if (((ABS(vVar4.x) < 0.01) && (ABS(vVar4.y) < 0.01)) &&
                                             ((ABS(vVar4.z + -0.75) < 0.01 &&
                                              (ABS(vVar4.w + -1.0) < 0.01)))) {
                                            if ((this->super_StaticRenderTest).m_w < 2) {
                                              pcVar3 = "1 < m_w";
                                            }
                                            else if (y < (this->super_StaticRenderTest).m_h) {
                                              vVar4 = rengine::StaticRenderTest::pixel
                                                                (&this->super_StaticRenderTest,1,y);
                                              if ((((ABS(vVar4.x) < 0.01) && (ABS(vVar4.y) < 0.01))
                                                  && (ABS(vVar4.z) < 0.01)) &&
                                                 (ABS(vVar4.w + -1.0) < 0.01)) {
                                                if ((this->super_StaticRenderTest).m_w < 1) {
                                                  pcVar3 = "0 < m_w";
                                                }
                                                else {
                                                  y_00 = y + -1;
                                                  if (y == 0) {
                                                    pcVar3 = "b-1 >= 0";
                                                  }
                                                  else if ((this->super_StaticRenderTest).m_h < y) {
                                                    pcVar3 = "b-1 < m_h";
                                                  }
                                                  else {
                                                    vVar4 = rengine::StaticRenderTest::pixel
                                                                      (&this->super_StaticRenderTest
                                                                       ,0,y_00);
                                                    if (((ABS(vVar4.x) < 0.01) &&
                                                        (ABS(vVar4.y) < 0.01)) &&
                                                       ((ABS(vVar4.z) < 0.01 &&
                                                        (ABS(vVar4.w + -1.0) < 0.01)))) {
                                                      if ((this->super_StaticRenderTest).m_w < 2) {
                                                        pcVar3 = "1 < m_w";
                                                      }
                                                      else if ((this->super_StaticRenderTest).m_h <
                                                               y) {
                                                        pcVar3 = "b-1 < m_h";
                                                      }
                                                      else {
                                                        vVar4 = rengine::StaticRenderTest::pixel
                                                                          (&this->
                                                  super_StaticRenderTest,1,y_00);
                                                  if (((ABS(vVar4.x) < 0.01) &&
                                                      (ABS(vVar4.y) < 0.01)) &&
                                                     ((ABS(vVar4.z) < 0.01 &&
                                                      (ABS(vVar4.w + -1.0) < 0.01)))) {
                                                    if ((int)x < (this->super_StaticRenderTest).m_w)
                                                    {
                                                      if (y < (this->super_StaticRenderTest).m_h) {
                                                        vVar4 = rengine::StaticRenderTest::pixel
                                                                          (&this->
                                                  super_StaticRenderTest,x,y);
                                                  if ((((ABS(vVar4.x + -0.5) < 0.01) &&
                                                       (ABS(vVar4.y + -0.5) < 0.01)) &&
                                                      (ABS(vVar4.z + -0.5) < 0.01)) &&
                                                     (ABS(vVar4.w + -1.0) < 0.01)) {
                                                    if ((this->super_StaticRenderTest).m_w < (int)x)
                                                    {
                                                      pcVar3 = "r-1 < m_w";
                                                    }
                                                    else if (y < (this->super_StaticRenderTest).m_h)
                                                    {
                                                      vVar4 = rengine::StaticRenderTest::pixel
                                                                        (&this->
                                                  super_StaticRenderTest,x_00,y);
                                                  if (((ABS(vVar4.x) < 0.01) &&
                                                      (ABS(vVar4.y) < 0.01)) &&
                                                     ((ABS(vVar4.z) < 0.01 &&
                                                      (ABS(vVar4.w + -1.0) < 0.01)))) {
                                                    if ((int)x < (this->super_StaticRenderTest).m_w)
                                                    {
                                                      if ((this->super_StaticRenderTest).m_h < y) {
                                                        pcVar3 = "b-1 < m_h";
                                                      }
                                                      else {
                                                        vVar4 = rengine::StaticRenderTest::pixel
                                                                          (&this->
                                                  super_StaticRenderTest,x,y_00);
                                                  if (((ABS(vVar4.x) < 0.01) &&
                                                      (ABS(vVar4.y) < 0.01)) &&
                                                     ((ABS(vVar4.z) < 0.01 &&
                                                      (ABS(vVar4.w + -1.0) < 0.01)))) {
                                                    if ((this->super_StaticRenderTest).m_w < (int)x)
                                                    {
                                                      pcVar3 = "r-1 < m_w";
                                                    }
                                                    else if ((this->super_StaticRenderTest).m_h < y)
                                                    {
                                                      pcVar3 = "b-1 < m_h";
                                                    }
                                                    else {
                                                      vVar4 = rengine::StaticRenderTest::pixel
                                                                        (&this->
                                                  super_StaticRenderTest,x_00,y_00);
                                                  if ((((ABS(vVar4.x) < 0.01) &&
                                                       (ABS(vVar4.y) < 0.01)) &&
                                                      (ABS(vVar4.z) < 0.01)) &&
                                                     (ABS(vVar4.w + -1.0) < 0.01)) {
                                                    return;
                                                  }
                                                  poVar1 = std::operator<<((ostream *)&std::cout,
                                                                           "pixels differ: (");
                                                  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 +
                                                                              -0x18) + 0x18) =
                                                       *(uint *)(poVar1 + *(long *)(*(long *)poVar1
                                                                                   + -0x18) + 0x18)
                                                       & 0xffffffb5 | 2;
                                                  poVar1 = (ostream *)
                                                           std::ostream::operator<<(poVar1,x_00);
                                                  poVar1 = std::operator<<(poVar1,",");
                                                  poVar1 = (ostream *)
                                                           std::ostream::operator<<(poVar1,y_00);
                                                  poVar1 = std::operator<<(poVar1,")=");
                                                  poVar2 = (ostream *)(ulong)x_00;
                                                  vVar4 = rengine::StaticRenderTest::pixel
                                                                    (&this->super_StaticRenderTest,
                                                                     x_00,y_00);
                                                  poVar1 = rengine::operator<<((rengine *)poVar1,
                                                                               poVar2,vVar4);
                                                  pcVar3 = "; expected=";
                                                  poVar1 = std::operator<<(poVar1,"; expected=");
                                                  poVar1 = rengine::operator<<((rengine *)poVar1,
                                                                               (ostream *)pcVar3,
                                                                               (vec4)(ZEXT816(
                                                  0x3f80000000000000) << 0x40));
                                                  std::endl<char,std::char_traits<char>>(poVar1);
                                                  pcVar3 = "false";
                                                  }
                                                  __assert_fail(pcVar3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                                  ,0x8c,
                                                  "virtual void TexturesOnViewportEdge::check()");
                                                  }
                                                  poVar1 = std::operator<<((ostream *)&std::cout,
                                                                           "pixels differ: (");
                                                  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 +
                                                                              -0x18) + 0x18) =
                                                       *(uint *)(poVar1 + *(long *)(*(long *)poVar1
                                                                                   + -0x18) + 0x18)
                                                       & 0xffffffb5 | 2;
                                                  poVar1 = (ostream *)
                                                           std::ostream::operator<<(poVar1,x);
                                                  poVar1 = std::operator<<(poVar1,",");
                                                  poVar1 = (ostream *)
                                                           std::ostream::operator<<(poVar1,y_00);
                                                  poVar1 = std::operator<<(poVar1,")=");
                                                  poVar2 = (ostream *)(ulong)x;
                                                  vVar4 = rengine::StaticRenderTest::pixel
                                                                    (&this->super_StaticRenderTest,x
                                                                     ,y_00);
                                                  poVar1 = rengine::operator<<((rengine *)poVar1,
                                                                               poVar2,vVar4);
                                                  pcVar3 = "; expected=";
                                                  poVar1 = std::operator<<(poVar1,"; expected=");
                                                  poVar1 = rengine::operator<<((rengine *)poVar1,
                                                                               (ostream *)pcVar3,
                                                                               (vec4)(ZEXT816(
                                                  0x3f80000000000000) << 0x40));
                                                  std::endl<char,std::char_traits<char>>(poVar1);
                                                  pcVar3 = "false";
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = "r < m_w";
                                                  }
                                                  __assert_fail(pcVar3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                                  ,0x8b,
                                                  "virtual void TexturesOnViewportEdge::check()");
                                                  }
                                                  poVar1 = std::operator<<((ostream *)&std::cout,
                                                                           "pixels differ: (");
                                                  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 +
                                                                              -0x18) + 0x18) =
                                                       *(uint *)(poVar1 + *(long *)(*(long *)poVar1
                                                                                   + -0x18) + 0x18)
                                                       & 0xffffffb5 | 2;
                                                  poVar1 = (ostream *)
                                                           std::ostream::operator<<(poVar1,x_00);
                                                  poVar1 = std::operator<<(poVar1,",");
                                                  poVar1 = (ostream *)
                                                           std::ostream::operator<<(poVar1,y);
                                                  poVar1 = std::operator<<(poVar1,")=");
                                                  poVar2 = (ostream *)(ulong)x_00;
                                                  vVar4 = rengine::StaticRenderTest::pixel
                                                                    (&this->super_StaticRenderTest,
                                                                     x_00,y);
                                                  poVar1 = rengine::operator<<((rengine *)poVar1,
                                                                               poVar2,vVar4);
                                                  pcVar3 = "; expected=";
                                                  poVar1 = std::operator<<(poVar1,"; expected=");
                                                  poVar1 = rengine::operator<<((rengine *)poVar1,
                                                                               (ostream *)pcVar3,
                                                                               (vec4)(ZEXT816(
                                                  0x3f80000000000000) << 0x40));
                                                  std::endl<char,std::char_traits<char>>(poVar1);
                                                  pcVar3 = "false";
                                                  }
                                                  else {
                                                    pcVar3 = "b < m_h";
                                                  }
                                                  __assert_fail(pcVar3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                                  ,0x8a,
                                                  "virtual void TexturesOnViewportEdge::check()");
                                                  }
                                                  poVar1 = std::operator<<((ostream *)&std::cout,
                                                                           "pixels differ: (");
                                                  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 +
                                                                              -0x18) + 0x18) =
                                                       *(uint *)(poVar1 + *(long *)(*(long *)poVar1
                                                                                   + -0x18) + 0x18)
                                                       & 0xffffffb5 | 2;
                                                  poVar1 = (ostream *)
                                                           std::ostream::operator<<(poVar1,x);
                                                  poVar1 = std::operator<<(poVar1,",");
                                                  poVar1 = (ostream *)
                                                           std::ostream::operator<<(poVar1,y);
                                                  poVar1 = std::operator<<(poVar1,")=");
                                                  poVar2 = (ostream *)(ulong)x;
                                                  vVar4 = rengine::StaticRenderTest::pixel
                                                                    (&this->super_StaticRenderTest,x
                                                                     ,y);
                                                  poVar1 = rengine::operator<<((rengine *)poVar1,
                                                                               poVar2,vVar4);
                                                  pcVar3 = "; expected=";
                                                  poVar1 = std::operator<<(poVar1,"; expected=");
                                                  v_00.z = 0.5;
                                                  v_00.w = 1.0;
                                                  v_00.x = 0.5;
                                                  v_00.y = 0.5;
                                                  poVar1 = rengine::operator<<((rengine *)poVar1,
                                                                               (ostream *)pcVar3,
                                                                               v_00);
                                                  std::endl<char,std::char_traits<char>>(poVar1);
                                                  pcVar3 = "false";
                                                  }
                                                  else {
                                                    pcVar3 = "b < m_h";
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = "r < m_w";
                                                  }
                                                  __assert_fail(pcVar3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                                  ,0x89,
                                                  "virtual void TexturesOnViewportEdge::check()");
                                                  }
                                                  poVar1 = std::operator<<((ostream *)&std::cout,
                                                                           "pixels differ: (");
                                                  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 +
                                                                              -0x18) + 0x18) =
                                                       *(uint *)(poVar1 + *(long *)(*(long *)poVar1
                                                                                   + -0x18) + 0x18)
                                                       & 0xffffffb5 | 2;
                                                  poVar1 = (ostream *)
                                                           std::ostream::operator<<(poVar1,1);
                                                  poVar1 = std::operator<<(poVar1,",");
                                                  poVar1 = (ostream *)
                                                           std::ostream::operator<<(poVar1,y_00);
                                                  poVar1 = std::operator<<(poVar1,")=");
                                                  poVar2 = (ostream *)0x1;
                                                  vVar4 = rengine::StaticRenderTest::pixel
                                                                    (&this->super_StaticRenderTest,1
                                                                     ,y_00);
                                                  poVar1 = rengine::operator<<((rengine *)poVar1,
                                                                               poVar2,vVar4);
                                                  pcVar3 = "; expected=";
                                                  poVar1 = std::operator<<(poVar1,"; expected=");
                                                  poVar1 = rengine::operator<<((rengine *)poVar1,
                                                                               (ostream *)pcVar3,
                                                                               (vec4)(ZEXT816(
                                                  0x3f80000000000000) << 0x40));
                                                  std::endl<char,std::char_traits<char>>(poVar1);
                                                  pcVar3 = "false";
                                                  }
                                                  __assert_fail(pcVar3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                                  ,0x86,
                                                  "virtual void TexturesOnViewportEdge::check()");
                                                  }
                                                  poVar1 = std::operator<<((ostream *)&std::cout,
                                                                           "pixels differ: (");
                                                  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 +
                                                                              -0x18) + 0x18) =
                                                       *(uint *)(poVar1 + *(long *)(*(long *)poVar1
                                                                                   + -0x18) + 0x18)
                                                       & 0xffffffb5 | 2;
                                                  poVar1 = (ostream *)
                                                           std::ostream::operator<<(poVar1,0);
                                                  poVar1 = std::operator<<(poVar1,",");
                                                  poVar1 = (ostream *)
                                                           std::ostream::operator<<(poVar1,y_00);
                                                  poVar1 = std::operator<<(poVar1,")=");
                                                  poVar2 = (ostream *)0x0;
                                                  vVar4 = rengine::StaticRenderTest::pixel
                                                                    (&this->super_StaticRenderTest,0
                                                                     ,y_00);
                                                  poVar1 = rengine::operator<<((rengine *)poVar1,
                                                                               poVar2,vVar4);
                                                  pcVar3 = "; expected=";
                                                  poVar1 = std::operator<<(poVar1,"; expected=");
                                                  poVar1 = rengine::operator<<((rengine *)poVar1,
                                                                               (ostream *)pcVar3,
                                                                               (vec4)(ZEXT816(
                                                  0x3f80000000000000) << 0x40));
                                                  std::endl<char,std::char_traits<char>>(poVar1);
                                                  pcVar3 = "false";
                                                  }
                                                }
                                                __assert_fail(pcVar3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                                  ,0x85,
                                                  "virtual void TexturesOnViewportEdge::check()");
                                              }
                                              poVar1 = std::operator<<((ostream *)&std::cout,
                                                                       "pixels differ: (");
                                              *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18)
                                                                 + 0x18) =
                                                   *(uint *)(poVar1 + *(long *)(*(long *)poVar1 +
                                                                               -0x18) + 0x18) &
                                                   0xffffffb5 | 2;
                                              poVar1 = (ostream *)std::ostream::operator<<(poVar1,1)
                                              ;
                                              poVar1 = std::operator<<(poVar1,",");
                                              poVar1 = (ostream *)std::ostream::operator<<(poVar1,y)
                                              ;
                                              poVar1 = std::operator<<(poVar1,")=");
                                              poVar2 = (ostream *)0x1;
                                              vVar4 = rengine::StaticRenderTest::pixel
                                                                (&this->super_StaticRenderTest,1,y);
                                              poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,
                                                                           vVar4);
                                              pcVar3 = "; expected=";
                                              poVar1 = std::operator<<(poVar1,"; expected=");
                                              poVar1 = rengine::operator<<((rengine *)poVar1,
                                                                           (ostream *)pcVar3,
                                                                           (vec4)(ZEXT816(
                                                  0x3f80000000000000) << 0x40));
                                              std::endl<char,std::char_traits<char>>(poVar1);
                                              pcVar3 = "false";
                                            }
                                            else {
                                              pcVar3 = "b < m_h";
                                            }
                                            __assert_fail(pcVar3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                                  ,0x84,
                                                  "virtual void TexturesOnViewportEdge::check()");
                                          }
                                          poVar1 = std::operator<<((ostream *)&std::cout,
                                                                   "pixels differ: (");
                                          *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) +
                                                             0x18) =
                                               *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18)
                                                                  + 0x18) & 0xffffffb5 | 2;
                                          poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
                                          poVar1 = std::operator<<(poVar1,",");
                                          poVar1 = (ostream *)std::ostream::operator<<(poVar1,y);
                                          poVar1 = std::operator<<(poVar1,")=");
                                          poVar2 = (ostream *)0x0;
                                          vVar4 = rengine::StaticRenderTest::pixel
                                                            (&this->super_StaticRenderTest,0,y);
                                          poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,
                                                                       vVar4);
                                          pcVar3 = "; expected=";
                                          poVar1 = std::operator<<(poVar1,"; expected=");
                                          poVar1 = rengine::operator<<((rengine *)poVar1,
                                                                       (ostream *)pcVar3,
                                                                       (vec4)(ZEXT816(
                                                  0x3f8000003f400000) << 0x40));
                                          std::endl<char,std::char_traits<char>>(poVar1);
                                          pcVar3 = "false";
                                        }
                                        else {
                                          pcVar3 = "b < m_h";
                                        }
                                      }
                                      __assert_fail(pcVar3,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                                  ,0x83,
                                                  "virtual void TexturesOnViewportEdge::check()");
                                    }
                                    poVar1 = std::operator<<((ostream *)&std::cout,
                                                             "pixels differ: (");
                                    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
                                         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) +
                                                            0x18) & 0xffffffb5 | 2;
                                    poVar1 = (ostream *)std::ostream::operator<<(poVar1,x_00);
                                    poVar1 = std::operator<<(poVar1,",");
                                    poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
                                    poVar1 = std::operator<<(poVar1,")=");
                                    poVar2 = (ostream *)(ulong)x_00;
                                    vVar4 = rengine::StaticRenderTest::pixel
                                                      (&this->super_StaticRenderTest,x_00,1);
                                    poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar4);
                                    pcVar3 = "; expected=";
                                    poVar1 = std::operator<<(poVar1,"; expected=");
                                    poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3
                                                                 ,(vec4)(ZEXT816(0x3f80000000000000)
                                                                        << 0x40));
                                    std::endl<char,std::char_traits<char>>(poVar1);
                                    pcVar3 = "false";
                                  }
                                  __assert_fail(pcVar3,
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                                ,0x80,"virtual void TexturesOnViewportEdge::check()"
                                               );
                                }
                                poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                                *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
                                     *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) &
                                     0xffffffb5 | 2;
                                poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
                                poVar1 = std::operator<<(poVar1,",");
                                poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
                                poVar1 = std::operator<<(poVar1,")=");
                                poVar2 = (ostream *)(ulong)x;
                                vVar4 = rengine::StaticRenderTest::pixel
                                                  (&this->super_StaticRenderTest,x,1);
                                poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar4);
                                pcVar3 = "; expected=";
                                poVar1 = std::operator<<(poVar1,"; expected=");
                                poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,
                                                             (vec4)(ZEXT816(0x3f80000000000000) <<
                                                                   0x40));
                                std::endl<char,std::char_traits<char>>(poVar1);
                                pcVar3 = "false";
                              }
                            }
                            else {
                              pcVar3 = "r < m_w";
                            }
                            __assert_fail(pcVar3,
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                          ,0x7f,"virtual void TexturesOnViewportEdge::check()");
                          }
                          poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                          *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
                               *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) &
                               0xffffffb5 | 2;
                          poVar1 = (ostream *)std::ostream::operator<<(poVar1,x_00);
                          poVar1 = std::operator<<(poVar1,",");
                          poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
                          poVar1 = std::operator<<(poVar1,")=");
                          poVar2 = (ostream *)(ulong)x_00;
                          vVar4 = rengine::StaticRenderTest::pixel
                                            (&this->super_StaticRenderTest,x_00,0);
                          poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar4);
                          pcVar3 = "; expected=";
                          poVar1 = std::operator<<(poVar1,"; expected=");
                          poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,
                                                       (vec4)(ZEXT816(0x3f80000000000000) << 0x40));
                          std::endl<char,std::char_traits<char>>(poVar1);
                          pcVar3 = "false";
                        }
                        __assert_fail(pcVar3,
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                      ,0x7e,"virtual void TexturesOnViewportEdge::check()");
                      }
                      poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                      *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
                           *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) &
                           0xffffffb5 | 2;
                      poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
                      poVar1 = std::operator<<(poVar1,",");
                      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
                      poVar1 = std::operator<<(poVar1,")=");
                      poVar2 = (ostream *)(ulong)x;
                      vVar4 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,x,0);
                      poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar4);
                      pcVar3 = "; expected=";
                      poVar1 = std::operator<<(poVar1,"; expected=");
                      v.z = 0.0;
                      v.w = 1.0;
                      v.x = 0.0;
                      v.y = 0.25;
                      poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,v);
                      std::endl<char,std::char_traits<char>>(poVar1);
                      pcVar3 = "false";
                    }
                  }
                  else {
                    pcVar3 = "r < m_w";
                  }
                  __assert_fail(pcVar3,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                ,0x7d,"virtual void TexturesOnViewportEdge::check()");
                }
                poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
                     *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
                poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
                poVar1 = std::operator<<(poVar1,",");
                poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
                poVar1 = std::operator<<(poVar1,")=");
                poVar2 = (ostream *)0x0;
                vVar4 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0,1);
                poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar4);
                pcVar3 = "; expected=";
                poVar1 = std::operator<<(poVar1,"; expected=");
                poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,
                                             (vec4)(ZEXT816(0x3f80000000000000) << 0x40));
                std::endl<char,std::char_traits<char>>(poVar1);
                pcVar3 = "false";
              }
              __assert_fail(pcVar3,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                            ,0x7a,"virtual void TexturesOnViewportEdge::check()");
            }
            poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
            *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
                 *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
            poVar1 = std::operator<<(poVar1,",");
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
            poVar1 = std::operator<<(poVar1,")=");
            poVar2 = (ostream *)0x1;
            vVar4 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,1,1);
            poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar4);
            pcVar3 = "; expected=";
            poVar1 = std::operator<<(poVar1,"; expected=");
            poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,
                                         (vec4)(ZEXT816(0x3f80000000000000) << 0x40));
            std::endl<char,std::char_traits<char>>(poVar1);
            pcVar3 = "false";
          }
          __assert_fail(pcVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                        ,0x79,"virtual void TexturesOnViewportEdge::check()");
        }
        poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
             *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
        poVar1 = std::operator<<(poVar1,")=");
        poVar2 = (ostream *)0x1;
        vVar4 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,1,0);
        poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar4);
        pcVar3 = "; expected=";
        poVar1 = std::operator<<(poVar1,"; expected=");
        poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,
                                     (vec4)(ZEXT816(0x3f80000000000000) << 0x40));
        std::endl<char,std::char_traits<char>>(poVar1);
        pcVar3 = "false";
      }
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0x78,"virtual void TexturesOnViewportEdge::check()");
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
    poVar1 = std::operator<<(poVar1,")=");
    poVar2 = (ostream *)0x0;
    vVar4 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0,0);
    poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar4);
    pcVar3 = "; expected=";
    poVar1 = std::operator<<(poVar1,"; expected=");
    vVar4.z = 0.0;
    vVar4.w = 1.0;
    vVar4.x = 0.5;
    vVar4.y = 0.0;
    poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,vVar4);
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar3 = "false";
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                ,0x77,"virtual void TexturesOnViewportEdge::check()");
}

Assistant:

void check() override {
        vec2 s = surface()->size();

        int r = s.x - 1;
        int b = s.y - 1;

        // Top/left 50% red
        check_pixel(0, 0, vec4(0.5, 0, 0, 1));
        check_pixel(1, 0, vec4(0.0, 0, 0, 1));
        check_pixel(1, 1, vec4(0.0, 0, 0, 1));
        check_pixel(0, 1, vec4(0.0, 0, 0, 1));

        // Top/right 25% green
        check_pixel(r,   0, vec4(0, 0.25, 0, 1));
        check_pixel(r-1, 0, vec4(0.0, 0, 0, 1));
        check_pixel(r,   1, vec4(0.0, 0, 0, 1));
        check_pixel(r-1, 1, vec4(0.0, 0, 0, 1));

        // Bottom/left 75% blue
        check_pixel(0, b,   vec4(0, 0, 0.75, 1));
        check_pixel(1, b,   vec4(0, 0, 0, 1));
        check_pixel(0, b-1, vec4(0, 0, 0, 1));
        check_pixel(1, b-1, vec4(0, 0, 0, 1));

        // Top/right 50% white
        check_pixel(r, b,  vec4(0.5, 0.5, 0.5, 1));
        check_pixel(r-1, b, vec4(0, 0, 0, 1));
        check_pixel(r, b-1, vec4(0, 0, 0, 1));
        check_pixel(r-1, b-1, vec4(0, 0, 0, 1));
    }